

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmScreen::ensureModeSet(QEglFSKmsGbmScreen *this,uint32_t fb)

{
  int iVar1;
  int iVar2;
  QKmsOutput *pQVar3;
  QKmsDevice *pQVar4;
  long lVar5;
  reference p_Var6;
  drmModeAtomicReq *pdVar7;
  int *piVar8;
  char *pcVar9;
  int in_ESI;
  QEglFSKmsScreen *in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  int ret;
  drmModeAtomicReq *request;
  bool alreadySet;
  drmModeCrtcPtr currentMode;
  bool doModeSet;
  int fd;
  QKmsOutput *op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint32_t uVar11;
  undefined4 in_stack_ffffffffffffff04;
  QString *in_stack_ffffffffffffff08;
  uint32_t *this_00;
  QString local_98 [2];
  QString local_68 [2];
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QEglFSKmsScreen::output(in_RDI);
  pQVar4 = (QKmsDevice *)QEglFSKmsScreen::device(in_RDI);
  iVar1 = QKmsDevice::fd(pQVar4);
  if (((pQVar3->mode_set & 1U) == 0) || (((byte)in_RDI[0x288] & 1) != 0)) {
    pQVar3->mode_set = true;
    in_RDI[0x288] = (QEglFSKmsScreen)0x0;
    lVar5 = drmModeGetCrtc(iVar1,pQVar3->crtc_id);
    bVar10 = false;
    if ((lVar5 != 0) && (bVar10 = false, *(int *)(lVar5 + 4) == in_ESI)) {
      p_Var6 = QList<_drmModeModeInfo>::operator[]
                         ((QList<_drmModeModeInfo> *)in_stack_fffffffffffffef0,
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      iVar2 = memcmp((void *)(lVar5 + 0x1c),p_Var6,0x44);
      bVar10 = iVar2 == 0;
    }
    if (lVar5 != 0) {
      drmModeFreeCrtc(lVar5);
    }
    if (!bVar10) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglfsKmsDebug();
      anon_unknown.dwarf_7f413::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffef0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while (bVar10 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                ((QLoggingCategoryMacroHolder *)&local_18), bVar10) {
        anon_unknown.dwarf_7f413::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11c089);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char *)0x11c0a2);
        (**(code **)(*(long *)in_RDI + 0x90))(local_68);
        QtPrivate::asString(local_68);
        QString::toLocal8Bit(in_stack_ffffffffffffff08);
        pcVar9 = QByteArray::constData((QByteArray *)0x11c0e2);
        QMessageLogger::debug(local_38,"Setting mode for screen %s",pcVar9);
        QByteArray::~QByteArray((QByteArray *)0x11c108);
        QString::~QString((QString *)0x11c115);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      pQVar4 = (QKmsDevice *)QEglFSKmsScreen::device(in_RDI);
      bVar10 = QKmsDevice::hasAtomicSupport(pQVar4);
      if (bVar10) {
        QEglFSKmsScreen::device(in_RDI);
        pdVar7 = QKmsDevice::threadLocalAtomicRequest
                           ((QKmsDevice *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        if (pdVar7 != (drmModeAtomicReq *)0x0) {
          drmModeAtomicAddProperty
                    (pdVar7,pQVar3->connector_id,pQVar3->crtcIdPropertyId,pQVar3->crtc_id);
          drmModeAtomicAddProperty
                    (pdVar7,pQVar3->crtc_id,pQVar3->modeIdPropertyId,pQVar3->mode_blob_id);
          drmModeAtomicAddProperty(pdVar7,pQVar3->crtc_id,pQVar3->activePropertyId,1);
        }
      }
      else {
        uVar11 = pQVar3->crtc_id;
        this_00 = &pQVar3->connector_id;
        p_Var6 = QList<_drmModeModeInfo>::operator[]
                           ((QList<_drmModeModeInfo> *)in_stack_fffffffffffffef0,
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        iVar1 = drmModeSetCrtc(iVar1,uVar11,in_ESI,0,0,this_00,1,p_Var6);
        if (iVar1 == 0) {
          (**(code **)(*(long *)in_RDI + 200))(in_RDI,0);
        }
        else {
          piVar8 = __errno_location();
          iVar1 = *piVar8;
          (**(code **)(*(long *)in_RDI + 0x90))(local_98);
          QtPrivate::asString(local_98);
          QString::toLocal8Bit((QString *)this_00);
          pcVar9 = QByteArray::constData((QByteArray *)0x11c2a5);
          qErrnoWarning(iVar1,"Could not set DRM mode for screen %s",pcVar9);
          QByteArray::~QByteArray((QByteArray *)0x11c2c7);
          QString::~QString((QString *)0x11c2d4);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmScreen::ensureModeSet(uint32_t fb)
{
    QKmsOutput &op(output());
    const int fd = device()->fd();

    if (!op.mode_set || needsNewModeSetForNextFb) {
        op.mode_set = true;
        needsNewModeSetForNextFb = false;

        bool doModeSet = true;
        drmModeCrtcPtr currentMode = drmModeGetCrtc(fd, op.crtc_id);
        const bool alreadySet = currentMode && currentMode->buffer_id == fb && !memcmp(&currentMode->mode, &op.modes[op.mode], sizeof(drmModeModeInfo));
        if (currentMode)
            drmModeFreeCrtc(currentMode);
        if (alreadySet)
            doModeSet = false;

        if (doModeSet) {
            qCDebug(qLcEglfsKmsDebug, "Setting mode for screen %s", qPrintable(name()));

            if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
                drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
                if (request) {
                    drmModeAtomicAddProperty(request, op.connector_id, op.crtcIdPropertyId, op.crtc_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.modeIdPropertyId, op.mode_blob_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.activePropertyId, 1);
                }
#endif
            } else {
                int ret = drmModeSetCrtc(fd,
                                         op.crtc_id,
                                         fb,
                                         0, 0,
                                         &op.connector_id, 1,
                                         &op.modes[op.mode]);

                if (ret == 0)
                    setPowerState(PowerStateOn);
                else
                    qErrnoWarning(errno, "Could not set DRM mode for screen %s", qPrintable(name()));
            }
        }
    }
}